

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wizard.c
# Opt level: O0

int mon_has_special(monst *mtmp)

{
  boolean bVar1;
  obj *local_20;
  obj *otmp;
  monst *mtmp_local;
  
  local_20 = mtmp->minvent;
  while( true ) {
    if (local_20 == (obj *)0x0) {
      return 0;
    }
    if ((((local_20->otyp == 0xd9) || (bVar1 = is_quest_artifact(local_20), bVar1 != '\0')) ||
        (local_20->otyp == 0x10c)) || ((local_20->otyp == 0x10b || (local_20->otyp == 0x1bd))))
    break;
    local_20 = local_20->nobj;
  }
  return 1;
}

Assistant:

int mon_has_special(struct monst *mtmp)
{
	struct obj *otmp;

	for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		if (otmp->otyp == AMULET_OF_YENDOR ||
			is_quest_artifact(otmp) ||
			otmp->otyp == BELL_OF_OPENING ||
			otmp->otyp == CANDELABRUM_OF_INVOCATION ||
			otmp->otyp == SPE_BOOK_OF_THE_DEAD) return 1;
	return 0;
}